

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_wrapper.cpp
# Opt level: O2

word_wrapper * __thiscall
pstore::command_line::word_wrapper::operator++
          (word_wrapper *__return_storage_ptr__,word_wrapper *this,int param_1)

{
  word_wrapper(__return_storage_ptr__,this);
  next(this);
  return __return_storage_ptr__;
}

Assistant:

word_wrapper word_wrapper::operator++ (int) {
                word_wrapper prev = *this;
                ++(*this);
                return prev;
            }